

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::Connector
          (Connector *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000158;
  App *in_stack_00000160;
  undefined1 in_stack_00000168 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  Connector *this_00;
  char *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff68;
  CoreApp *in_stack_ffffffffffffff70;
  bool local_5a;
  Connector *in_stack_ffffffffffffffc0;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  App::App(in_stack_00000160,(string_view)in_stack_00000168,in_stack_00000158);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff60);
  *in_RDI = &PTR__Connector_009bec58;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 1));
  if (bVar1) {
    peVar2 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x26130a);
    Federate::getCorePointer
              ((Federate *)
               ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
    CLI::std::shared_ptr<helics::Core>::shared_ptr
              ((shared_ptr<helics::Core> *)in_stack_ffffffffffffff50,
               (shared_ptr<helics::Core> *)in_stack_ffffffffffffff48);
  }
  else {
    CLI::std::shared_ptr<helics::Core>::shared_ptr
              ((shared_ptr<helics::Core> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  CoreApp::CoreApp(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    CLI::std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x261383);
  }
  else {
    CLI::std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x261370);
  }
  this_00 = (Connector *)(in_RDI + 0x1a);
  CLI::std::
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
  ::unordered_multimap
            ((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
              *)0x261399);
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::vector
            ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)0x2613af
            );
  CLI::std::
  vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
            *)0x2613c5);
  CLI::std::
  unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x2613db);
  CLI::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x2613f1);
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  *(undefined1 *)(in_RDI + 0x37) = 0;
  *(undefined1 *)((long)in_RDI + 0x1b9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1ba) = 0;
  processArgs(in_stack_ffffffffffffffc0);
  initialSetup(this_00);
  return;
}

Assistant:

Connector::Connector(std::vector<std::string> args):
    App("connector", std::move(args)), core((fed) ? fed->getCorePointer() : nullptr)
{
    processArgs();
    initialSetup();
}